

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.hpp
# Opt level: O3

void __thiscall
deqp::gls::VarSpec::VarSpec<tcu::Vector<float,2>>
          (VarSpec *this,string *name_,Vector<float,_2> *minValue_,Vector<float,_2> *maxValue_)

{
  pointer pcVar1;
  DataType DVar2;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name_->_M_string_length);
  DVar2 = glu::getDataTypeFloatVec(2);
  this->type = DVar2;
  (this->minValue).f[0] = minValue_->m_data[0];
  (this->minValue).f[1] = minValue_->m_data[1];
  (this->maxValue).f[0] = maxValue_->m_data[0];
  (this->maxValue).f[1] = maxValue_->m_data[1];
  return;
}

Assistant:

VarSpec (const std::string& name_, const T& minValue_, const T& maxValue_)	: name(name_) { set(minValue_, maxValue_); }